

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O2

void __thiscall
ki::dml::Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
Field(Field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this,
     string *name)

{
  size_t sVar1;
  string sStack_58;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  std::__cxx11::string::string((string *)&sStack_58,(string *)name);
  FieldBase::FieldBase(&this->super_FieldBase,&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  (this->super_FieldBase).super_Serializable._vptr_Serializable =
       (_func_int **)&PTR_write_to_0015f2d0;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = '\0';
  sVar1 = std::type_info::hash_code((type_info *)&std::__cxx11::string::typeinfo);
  (this->super_FieldBase).m_type_hash = sVar1;
  local_38 = local_28;
  local_30 = 0;
  local_28[0] = 0;
  std::__cxx11::string::operator=((string *)&this->m_value,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Field(std::string name) : FieldBase(name)
		{
			m_type_hash = typeid(ValueT).hash_code();
			m_value = ValueT();
		}